

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  void **ppvVar3;
  long *plVar4;
  void *pvVar5;
  uint uVar6;
  Vec_Ptr_t *__ptr;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar7;
  Vec_Str_t *vFixed;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *__s_00;
  word wVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  Sfm_Ntk_t *pSVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  
  __ptr = Abc_NtkAssignIDs2(pNtk);
  uVar2 = __ptr->nSize;
  pVVar13 = pNtk->vCos;
  iVar16 = pNtk->vCis->nSize + uVar2;
  iVar14 = pVVar13->nSize;
  uVar18 = iVar16 + iVar14;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  uVar17 = (iVar16 + iVar14) - 1;
  uVar6 = 8;
  if (6 < uVar17) {
    uVar6 = uVar18;
  }
  vFanins->nCap = uVar6;
  if (uVar6 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)(int)uVar6,0x10);
  }
  vFanins->pArray = pVVar7;
  vFanins->nSize = uVar18;
  vFixed = (Vec_Str_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar17) {
    uVar6 = uVar18;
  }
  vFixed->nCap = uVar6;
  if (uVar6 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)(int)uVar6);
  }
  vFixed->pArray = __s;
  vFixed->nSize = uVar18;
  memset(__s,0,(long)(int)uVar18);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nCap = uVar6;
  if (uVar6 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)(int)uVar6 << 3);
  }
  vTruths->pArray = __s_00;
  vTruths->nSize = uVar18;
  memset(__s_00,0,(long)(int)uVar18 << 3);
  if (0 < (int)uVar2) {
    ppvVar3 = __ptr->pArray;
    uVar15 = 0;
    do {
      plVar4 = (long *)ppvVar3[uVar15];
      wVar8 = Abc_SopToTruth((char *)plVar4[7],*(int *)((long)plVar4 + 0x1c));
      iVar14 = (int)plVar4[8];
      if (((long)iVar14 < 0) || ((int)uVar18 <= iVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      __s_00[iVar14] = wVar8;
      if (1 < wVar8 + 1) {
        lVar9 = (long)(int)*(uint *)(plVar4 + 8);
        if ((lVar9 < 0) || (uVar18 <= *(uint *)(plVar4 + 8))) goto LAB_0027b8bc;
        pVVar1 = pVVar7 + lVar9;
        iVar14 = *(int *)((long)plVar4 + 0x1c);
        if (pVVar7[lVar9].nCap < iVar14) {
          if (pVVar1->pArray == (int *)0x0) {
            piVar10 = (int *)malloc((long)iVar14 << 2);
          }
          else {
            piVar10 = (int *)realloc(pVVar1->pArray,(long)iVar14 << 2);
          }
          pVVar1->pArray = piVar10;
          if (piVar10 == (int *)0x0) goto LAB_0027b8fa;
          pVVar1->nCap = iVar14;
          iVar14 = *(int *)((long)plVar4 + 0x1c);
        }
        if (0 < iVar14) {
          lVar9 = 0;
          do {
            Vec_IntPush(pVVar1,*(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                                 (long)*(int *)(plVar4[4] + lVar9 * 4) * 8) + 0x40))
            ;
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)plVar4 + 0x1c));
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar2);
    pVVar13 = pNtk->vCos;
    iVar14 = pVVar13->nSize;
  }
  if (0 < iVar14) {
    lVar9 = 0;
    do {
      plVar4 = (long *)pVVar13->pArray[lVar9];
      lVar11 = (long)(int)plVar4[8];
      if ((lVar11 < 0) || ((int)uVar18 <= (int)plVar4[8])) {
LAB_0027b8bc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar1 = pVVar7 + lVar11;
      iVar14 = *(int *)((long)plVar4 + 0x1c);
      if (pVVar7[lVar11].nCap < iVar14) {
        if (pVVar1->pArray == (int *)0x0) {
          piVar10 = (int *)malloc((long)iVar14 << 2);
        }
        else {
          piVar10 = (int *)realloc(pVVar1->pArray,(long)iVar14 << 2);
        }
        pVVar1->pArray = piVar10;
        if (piVar10 == (int *)0x0) {
LAB_0027b8fa:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = iVar14;
        iVar14 = *(int *)((long)plVar4 + 0x1c);
      }
      if (0 < iVar14) {
        lVar11 = 0;
        do {
          Vec_IntPush(pVVar1,*(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                               (long)*(int *)(plVar4[4] + lVar11 * 4) * 8) + 0x40));
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar4 + 0x1c));
      }
      lVar9 = lVar9 + 1;
      pVVar13 = pNtk->vCos;
    } while (lVar9 < pVVar13->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pVVar13 = pNtk->vObjs;
  if (0 < pVVar13->nSize) {
    lVar9 = 0;
    do {
      pvVar5 = pVVar13->pArray[lVar9];
      if (((pvVar5 != (void *)0x0) && (iPivot <= lVar9)) &&
         ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) {
        iVar14 = *(int *)((long)pvVar5 + 0x40);
        if (((long)iVar14 < 0) || (vFixed->nSize <= iVar14)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        vFixed->pArray[iVar14] = '\x01';
        pVVar13 = pNtk->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar13->nSize);
  }
  pSVar12 = Sfm_NtkConstruct(vFanins,pNtk->vCis->nSize,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,
                             vTruths);
  return pSVar12;
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}